

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNodes_Expressions.h
# Opt level: O0

void __thiscall psy::C::CallExpressionSyntax::~CallExpressionSyntax(CallExpressionSyntax *this)

{
  void *in_RSI;
  CallExpressionSyntax *this_local;
  
  ~CallExpressionSyntax(this);
  Managed::operator_delete((Managed *)this,in_RSI);
  return;
}

Assistant:

class PSY_C_API CallExpressionSyntax final : public ExpressionSyntax
{
    AST_NODE_NK(CallExpression, Expression)

public:
    const ExpressionSyntax* expression() const { return expr_; }
    SyntaxToken openParenthesisToken() const { return tokenAtIndex(openParenTkIdx_); }
    const ExpressionListSyntax* arguments() const { return args_; }
    SyntaxToken closeParenthesisToken() const { return tokenAtIndex(closeParenTkIdx_); }

private:
    ExpressionSyntax* expr_ = nullptr;
    LexedTokens::IndexType openParenTkIdx_ = LexedTokens::invalidIndex();
    ExpressionListSyntax* args_ = nullptr;
    LexedTokens::IndexType closeParenTkIdx_ = LexedTokens::invalidIndex();
    AST_CHILD_LST4(expr_, openParenTkIdx_, args_, closeParenTkIdx_)
};

/**
 * \brief The MemberAccessExpressionSyntax class.
 *
 * \code
 * v.m
 * v->m
 * \endcode
 *
 * \remark 6.5.2.3
 *
 * \note Similar to:
 * - \c clang::MemberExpr of LLVM/Clang.
 * - \c clang::syntax::MemberExpression of Clang's Libtooling.
 * - \c Microsoft.CodeAnalysis.CSharp.Syntax.MemberAccessExpressionSyntax of Roslyn.
 */
class PSY_C_API MemberAccessExpressionSyntax final : public ExpressionSyntax
{
    AST_NODE_NK(MemberAccessExpression, Expression)

public:
    const ExpressionSyntax* expression() const { return expr_; }
    SyntaxToken operatorToken() const { return tokenAtIndex(oprtrTkIdx_); }
    const IdentifierNameSyntax* memberName() const { return memberName_; }

private:
    ExpressionSyntax* expr_ = nullptr;
    LexedTokens::IndexType oprtrTkIdx_ = LexedTokens::invalidIndex();
    IdentifierNameSyntax* memberName_ = nullptr;
    AST_CHILD_LST3(expr_, oprtrTkIdx_, memberName_)
};

/**
 * \brief The CompoundLiteralExpressionSyntax class.
 *
 * \remark 6.5.2.5
 *
 * \note Similar to:
 * - \c clang::CompoundLiteralExpr of LLVM/Clang.
 */
class PSY_C_API CompoundLiteralExpressionSyntax final : public ExpressionSyntax
{
    AST_NODE_1K(CompoundLiteralExpression, Expression)

public:
    SyntaxToken openParenthesisToken() const { return tokenAtIndex(openParenTkIdx_); }
    const TypeNameSyntax* typeName() const { return typeName_; }
    SyntaxToken closeParenthesisToken() const { return tokenAtIndex(closeParenTkIdx_); }
    const InitializerSyntax* initializer() const { return init_; }

private:
    LexedTokens::IndexType openParenTkIdx_ = LexedTokens::invalidIndex();
    TypeNameSyntax* typeName_ = nullptr;
    LexedTokens::IndexType closeParenTkIdx_ = LexedTokens::invalidIndex();
    InitializerSyntax* init_ = nullptr;
    AST_CHILD_LST4(openParenTkIdx_, typeName_, closeParenTkIdx_, init_)
};

/**
 * \brief The TypeTraitExpressionSyntax class.
 *
 * Represents a `sizeof' or an `_Alignof' expression. The operator's argument
 * is:
 *   - a TypeNameSyntax, if surrounded by parenthesis, or
 *   - an ExpressionSyntax, otherwise.
 *
 * \code
 * sizeof x
 * sizeof(x)
 * _Alignof(x)
 * \endcode
 *
 * \remark 6.5.3.4
 *
 * \note Similar to:
 * - \c clang::UnaryExprOrTypeTraitExpr of LLVM/Clang.
 * - \c clang::syntax::PrefixUnaryOperatorExpression of Clang's Libtooling.
 * - \c Microsoft.CodeAnalysis.CSharp.Syntax.SizeOfExpressionSyntax of Roslyn.
 */
class PSY_C_API TypeTraitExpressionSyntax final : public ExpressionSyntax
{
    AST_NODE_NK(TypeTraitExpression, Expression)

public:
    SyntaxToken operatorToken() const { return tokenAtIndex(oprtrTkIdx_); }
    const TypeReferenceSyntax* tyReference() const { return tyRef_; }

private:
    LexedTokens::IndexType oprtrTkIdx_ = LexedTokens::invalidIndex();
    TypeReferenceSyntax* tyRef_ = nullptr;
    AST_CHILD_LST2(oprtrTkIdx_, tyRef_);
};

/**
 * \brief The CastExpressionSyntax class.
 *
 * \code
 * (int)v
 * (t)v
 * \endcode
 *
 * \remark 6.5.4
 *
 * \note Similar to:
 * - \c clang::CStyleCastExpr of LLVM/Clang.
 * - \c Microsoft.CodeAnalysis.CSharp.Syntax.CastExpressionSyntax of Roslyn.
 */
class PSY_C_API CastExpressionSyntax final : public ExpressionSyntax
{
    AST_NODE_1K(CastExpression, Expression)

public:
    SyntaxToken openParenthesisToken() const { return tokenAtIndex(openParenTkIdx_); }
    const TypeNameSyntax* typeName() const { return typeName_; }
    SyntaxToken closeParenthesisToken() const { return tokenAtIndex(closeParenTkIdx_); }
    const ExpressionSyntax* expression() const { return expr_; }

private:
    LexedTokens::IndexType openParenTkIdx_ = LexedTokens::invalidIndex();
    TypeNameSyntax* typeName_ = nullptr;
    LexedTokens::IndexType closeParenTkIdx_ = LexedTokens::invalidIndex();;
    ExpressionSyntax* expr_ = nullptr;
    AST_CHILD_LST4(openParenTkIdx_, typeName_, closeParenTkIdx_, expr_);
}